

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaRedefPtr_conflict
xmlSchemaAddRedef(xmlSchemaParserCtxtPtr pctxt,xmlSchemaBucketPtr_conflict targetBucket,void *item,
                 xmlChar *refName,xmlChar *refTargetNs)

{
  xmlSchemaConstructionCtxtPtr pxVar1;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlSchemaRedefPtr_conflict pxVar3;
  
  pxVar2 = (xmlSchemaRedefPtr_conflict)(*xmlMalloc)(0x38);
  if (pxVar2 == (xmlSchemaRedefPtr_conflict)0x0) {
    xmlSchemaPErrMemory(pctxt);
  }
  else {
    pxVar2->next = (xmlSchemaRedefPtr)0x0;
    pxVar2->item = (xmlSchemaBasicItemPtr)0x0;
    pxVar2->reference = (xmlSchemaBasicItemPtr)0x0;
    pxVar2->target = (xmlSchemaBasicItemPtr)0x0;
    pxVar2->item = (xmlSchemaBasicItemPtr)item;
    pxVar2->targetBucket = targetBucket;
    pxVar2->refName = refName;
    pxVar2->refTargetNs = refTargetNs;
    pxVar1 = pctxt->constructor;
    if (pxVar1->redefs == (xmlSchemaRedefPtr_conflict)0x0) {
      pxVar3 = (xmlSchemaRedefPtr_conflict)&pxVar1->redefs;
    }
    else {
      pxVar3 = pxVar1->lastRedef;
    }
    pxVar3->next = pxVar2;
    pxVar1->lastRedef = pxVar2;
  }
  return pxVar2;
}

Assistant:

static xmlSchemaRedefPtr
xmlSchemaAddRedef(xmlSchemaParserCtxtPtr pctxt,
		  xmlSchemaBucketPtr targetBucket,
		  void *item,
		  const xmlChar *refName,
		  const xmlChar *refTargetNs)
{
    xmlSchemaRedefPtr ret;

    ret = (xmlSchemaRedefPtr)
	xmlMalloc(sizeof(xmlSchemaRedef));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaRedef));
    ret->item = item;
    ret->targetBucket = targetBucket;
    ret->refName = refName;
    ret->refTargetNs = refTargetNs;
    if (WXS_CONSTRUCTOR(pctxt)->redefs == NULL)
	WXS_CONSTRUCTOR(pctxt)->redefs = ret;
    else
	WXS_CONSTRUCTOR(pctxt)->lastRedef->next = ret;
    WXS_CONSTRUCTOR(pctxt)->lastRedef = ret;

    return (ret);
}